

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environments.cpp
# Opt level: O0

bool fill_environment(shared_ptr<SchemeEnvironment> *env,shared_ptr<SchemePair> *np,
                     shared_ptr<SchemePair> *vp)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  bool local_81;
  shared_ptr<SchemeObject> local_70;
  shared_ptr<SchemeObject> local_60 [2];
  uint local_3c;
  undefined1 local_38 [8];
  shared_ptr<SchemeSymbol> s;
  shared_ptr<SchemePair> *vp_local;
  shared_ptr<SchemePair> *np_local;
  shared_ptr<SchemeEnvironment> *env_local;
  
  s.super___shared_ptr<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vp;
  while( true ) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)np);
    local_81 = false;
    if (bVar1) {
      bVar1 = std::operator!=(np,&scheme_nil);
      local_81 = false;
      if (bVar1) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)vp);
        local_81 = false;
        if (bVar1) {
          local_81 = std::operator!=(vp,&scheme_nil);
        }
      }
    }
    if (local_81 == false) break;
    std::__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)np);
    std::dynamic_pointer_cast<SchemeSymbol,SchemeObject>((shared_ptr<SchemeObject> *)local_38);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<SchemeEnvironment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<SchemeEnvironment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)env);
      peVar3 = std::__shared_ptr_access<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
      peVar4 = std::__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)vp);
      Context::set(&peVar2->context,&peVar3->value,&peVar4->car);
      std::__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)np);
      std::dynamic_pointer_cast<SchemePair,SchemeObject>(local_60);
      std::shared_ptr<SchemePair>::operator=(np,(shared_ptr<SchemePair> *)local_60);
      std::shared_ptr<SchemePair>::~shared_ptr((shared_ptr<SchemePair> *)local_60);
      std::__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<SchemePair,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)vp);
      std::dynamic_pointer_cast<SchemePair,SchemeObject>(&local_70);
      std::shared_ptr<SchemePair>::operator=(vp,(shared_ptr<SchemePair> *)&local_70);
      std::shared_ptr<SchemePair>::~shared_ptr((shared_ptr<SchemePair> *)&local_70);
    }
    else {
      env_local._7_1_ = 0;
    }
    local_3c = (uint)!bVar1;
    std::shared_ptr<SchemeSymbol>::~shared_ptr((shared_ptr<SchemeSymbol> *)local_38);
    if (local_3c != 0) {
LAB_001ce506:
      return (bool)(env_local._7_1_ & 1);
    }
  }
  env_local._7_1_ = 1;
  goto LAB_001ce506;
}

Assistant:

static bool fill_environment(const std::shared_ptr<SchemeEnvironment> &env, std::shared_ptr<SchemePair> np,
                             std::shared_ptr<SchemePair> vp)
{
    while(np && np != scheme_nil && vp && vp != scheme_nil)
    {
        auto s = std::dynamic_pointer_cast<SchemeSymbol>(np->car);
        if(!s)
            return false;
        env->context.set(s->value, vp->car);
        np = std::dynamic_pointer_cast<SchemePair>(np->cdr);
        vp = std::dynamic_pointer_cast<SchemePair>(vp->cdr);
    }
    return true;
}